

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

UInt32 RcTree_ReverseGetPrice(UInt16 *probs,int numBitLevels,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 price;
  UInt32 UVar1;
  int i;
  UInt32 m;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  UVar1 = 0;
  uVar2 = 1;
  while( true ) {
    bVar4 = numBitLevels == 0;
    numBitLevels = numBitLevels + -1;
    if (bVar4) break;
    uVar3 = symbol & 1;
    symbol = symbol >> 1;
    UVar1 = UVar1 + ProbPrices[(-uVar3 & 0x7f0 ^ (uint)probs[uVar2]) >> 4];
    uVar2 = (ulong)(uVar3 + (int)uVar2 * 2);
  }
  return UVar1;
}

Assistant:

static UInt32 RcTree_ReverseGetPrice(const CLzmaProb *probs, int numBitLevels, UInt32 symbol, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  UInt32 m = 1;
  int i;
  for (i = numBitLevels; i != 0; i--)
  {
    UInt32 bit = symbol & 1;
    symbol >>= 1;
    price += GET_PRICEa(probs[m], bit);
    m = (m << 1) | bit;
  }
  return price;
}